

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::synchronization::makeComputePipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipelineLayout pipelineLayout,VkShaderModule shaderModule,
          VkSpecializationInfo *specInfo,PipelineCacheData *pipelineCacheData)

{
  RefData<vk::Handle<(vk::HandleType)15>_> data;
  Handle<(vk::HandleType)15> *pHVar1;
  Move<vk::Handle<(vk::HandleType)15>_> local_128;
  RefData<vk::Handle<(vk::HandleType)15>_> local_108;
  undefined1 local_e8 [8];
  Unique<vk::Handle<(vk::HandleType)15>_> pipelineCache;
  VkComputePipelineCreateInfo pipelineInfo;
  VkPipelineShaderStageCreateInfo shaderStageInfo;
  VkSpecializationInfo *specInfo_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkShaderModule shaderModule_local;
  VkPipelineLayout pipelineLayout_local;
  Move<vk::Handle<(vk::HandleType)18>_> *pipeline;
  
  pipelineInfo.basePipelineIndex = 0x12;
  pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator._0_4_ =
       0x1d;
  pipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInfo._4_4_ = 0;
  pipelineInfo.pNext._0_4_ = 0;
  pipelineInfo._20_4_ = pipelineInfo._92_4_;
  pipelineInfo.flags = 0x12;
  pipelineInfo.stage.pNext = (void *)0x2000000000;
  pipelineInfo.stage.module.m_internal = (long)"pre_main" + 4;
  pipelineInfo.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineInfo.stage._4_4_ = 0;
  pipelineInfo.stage._16_8_ = shaderModule.m_internal;
  pipelineInfo.stage.pName = (char *)specInfo;
  pipelineInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pipelineLayout.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineInfo.layout,0);
  pipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  PipelineCacheData::createPipelineCache(&local_128,pipelineCacheData,vk,device);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_108,(Move *)&local_128);
  data.deleter.m_deviceIface = local_108.deleter.m_deviceIface;
  data.object.m_internal = local_108.object.m_internal;
  data.deleter.m_device = local_108.deleter.m_device;
  data.deleter.m_allocator = local_108.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)15>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)15>_> *)local_e8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&local_128);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)15>_> *)local_e8);
  ::vk::createComputePipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)pHVar1->m_internal,
             (VkComputePipelineCreateInfo *)
             &pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
              m_allocator,(VkAllocationCallbacks *)0x0);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)15>_> *)local_e8);
  PipelineCacheData::setFromPipelineCache
            (pipelineCacheData,vk,device,(VkPipelineCache)pHVar1->m_internal);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)15>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)15>_> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> makeComputePipeline (const DeviceInterface&		vk,
									  const VkDevice				device,
									  const VkPipelineLayout		pipelineLayout,
									  const VkShaderModule			shaderModule,
									  const VkSpecializationInfo*	specInfo,
									  PipelineCacheData&			pipelineCacheData)
{
	const VkPipelineShaderStageCreateInfo shaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags	flags;
		VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits			stage;
		shaderModule,											// VkShaderModule					module;
		"main",													// const char*						pName;
		specInfo,												// const VkSpecializationInfo*		pSpecializationInfo;
	};
	const VkComputePipelineCreateInfo pipelineInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		(VkPipelineCreateFlags)0,							// VkPipelineCreateFlags			flags;
		shaderStageInfo,									// VkPipelineShaderStageCreateInfo	stage;
		pipelineLayout,										// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};

	{
		const vk::Unique<vk::VkPipelineCache>	pipelineCache	(pipelineCacheData.createPipelineCache(vk, device));
		vk::Move<vk::VkPipeline>				pipeline		(createComputePipeline(vk, device, *pipelineCache, &pipelineInfo));

		// Refresh data from cache
		pipelineCacheData.setFromPipelineCache(vk, device, *pipelineCache);

		return pipeline;
	}
}